

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O1

int bounds_check(tgestate_t *state,vischar_t *vischar)

{
  byte bVar1;
  ushort uVar2;
  ushort uVar3;
  bool bVar4;
  wall_t *pwVar5;
  char cVar6;
  long lVar7;
  
  if (state->room_index == '\0') {
    pwVar5 = walls;
    cVar6 = -0x18;
    while( true ) {
      uVar2 = (state->saved_mappos).pos16.u;
      if (((uVar2 < (ushort)((ushort)pwVar5->minx * 8 + 2)) ||
          ((ushort)((ushort)pwVar5->maxx * 8 + 4) <= uVar2)) ||
         ((uVar2 = (state->saved_mappos).pos16.v, uVar2 < (ushort)((ushort)pwVar5->miny << 3) ||
          ((((ushort)((ushort)pwVar5->maxy << 3 | 4) <= uVar2 ||
            (uVar2 = (state->saved_mappos).pos16.w, uVar2 < (ushort)((ushort)pwVar5->minheight << 3)
            )) || ((ushort)((ushort)pwVar5->maxheight << 3 | 2) <= uVar2)))))) {
        pwVar5 = pwVar5 + 1;
        bVar4 = true;
      }
      else {
        vischar->counter_and_flags = vischar->counter_and_flags ^ 0x20;
        bVar4 = false;
      }
      if (!bVar4) break;
      cVar6 = cVar6 + '\x01';
      if (cVar6 == '\0') {
        return 0;
      }
    }
    return 1;
  }
  bVar1 = state->roomdef_dimensions_index;
  uVar2 = (state->saved_mappos).pos16.u;
  if (((((ushort)(interior_bounds_check::roomdef_dimensions[bVar1].x0 + 4) < uVar2) &&
       (uVar2 <= interior_bounds_check::roomdef_dimensions[bVar1].x1)) &&
      (uVar3 = (state->saved_mappos).pos16.v,
      interior_bounds_check::roomdef_dimensions[bVar1].y0 < uVar3)) &&
     ((int)(uint)uVar3 <= (int)(interior_bounds_check::roomdef_dimensions[bVar1].y1 - 4))) {
    if (state->roomdef_object_bounds_count != '\0') {
      lVar7 = 0;
      do {
        if ((((ushort)state->roomdef_object_bounds[lVar7].x0 <= (uVar2 & 0xff)) &&
            ((uVar2 & 0xff) < (ushort)state->roomdef_object_bounds[lVar7].x1)) &&
           (((ushort)state->roomdef_object_bounds[lVar7].y0 <= (uVar3 & 0xff) &&
            ((byte)uVar3 < state->roomdef_object_bounds[lVar7].y1)))) goto LAB_0010946e;
        lVar7 = lVar7 + 1;
      } while (state->roomdef_object_bounds_count != (uint8_t)lVar7);
    }
    return 0;
  }
LAB_0010946e:
  vischar->counter_and_flags = vischar->counter_and_flags ^ 0x20;
  return 1;
}

Assistant:

int bounds_check(tgestate_t *state, vischar_t *vischar)
{
  uint8_t       iters; /* was B */
  const wall_t *wall;  /* was DE */

  assert(state != NULL);
  ASSERT_VISCHAR_VALID(vischar);

  if (state->room_index > room_0_OUTDOORS)
    return interior_bounds_check(state, vischar);

  iters = NELEMS(walls); /* All walls and fences. */
  wall  = &walls[0];
  do
  {
    uint16_t minx, maxx, miny, maxy, minheight, maxheight;

    minx      = wall->minx      * 8;
    maxx      = wall->maxx      * 8;
    miny      = wall->miny      * 8;
    maxy      = wall->maxy      * 8;
    minheight = wall->minheight * 8;
    maxheight = wall->maxheight * 8;

    if (state->saved_mappos.pos16.u >= minx + 2   &&
        state->saved_mappos.pos16.u <  maxx + 4   &&
        state->saved_mappos.pos16.v >= miny       &&
        state->saved_mappos.pos16.v <  maxy + 4   &&
        state->saved_mappos.pos16.w >= minheight  &&
        state->saved_mappos.pos16.w <  maxheight + 2)
    {
      vischar->counter_and_flags ^= vischar_BYTE7_V_DOMINANT;
      return 1; // NZ => outwith wall bounds
    }

    wall++;
  }
  while (--iters);

  return 0; // Z => within wall bounds
}